

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src)

{
  bool bVar1;
  cmTargetInternals *pcVar2;
  cmCompiledGeneratorExpression *this_00;
  TargetPropertyEntry *this_01;
  size_type sVar3;
  auto_ptr<cmCompiledGeneratorExpression> local_108;
  TargetPropertyEntry *local_100;
  cmGeneratorExpression local_f8;
  cmCompiledGeneratorExpression *local_f0;
  auto_ptr<cmCompiledGeneratorExpression> local_e8;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  TargetPropertyEntryFinder local_a0;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_98;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_80;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_78;
  undefined1 local_70 [8];
  cmSourceFileLocation sfl;
  string *src_local;
  cmTarget *this_local;
  
  sfl.Name.field_2._8_8_ = src;
  cmSourceFileLocation::cmSourceFileLocation((cmSourceFileLocation *)local_70,this->Makefile,src);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_80._M_current =
       (TargetPropertyEntry **)
       std::
       vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       ::begin(&pcVar2->SourceEntries);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_98._M_current =
       (TargetPropertyEntry **)
       std::
       vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       ::end(&pcVar2->SourceEntries);
  TargetPropertyEntryFinder::TargetPropertyEntryFinder(&local_a0,(cmSourceFileLocation *)local_70);
  local_78 = std::
             find_if<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry**,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,TargetPropertyEntryFinder>
                       (local_80,local_98,local_a0);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  lfbt.Snapshot.Position.Position =
       (PositionType)
       std::
       vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       ::end(&pcVar2->SourceEntries);
  bVar1 = __gnu_cxx::operator==
                    (&local_78,
                     (__normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                      *)&lfbt.Snapshot.Position.Position);
  if (bVar1) {
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&pcVar2->SourceFilesMap);
    this->LinkImplementationLanguageIsContextDependent = true;
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)&ge);
    cmGeneratorExpression::Parse(&local_f8,(string *)&cge);
    local_f0 = (cmCompiledGeneratorExpression *)
               cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_f8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              (&local_e8,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_f0);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_f8);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_e8);
    cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_00,true);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    this_01 = (TargetPropertyEntry *)operator_new(0x10);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_108,&local_e8);
    cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
              (this_01,&local_108,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
    local_100 = this_01;
    std::
    vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
    ::push_back(&pcVar2->SourceEntries,&local_100);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_108);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_e8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
  }
  sVar3 = cmGeneratorExpression::Find(sfl.Name.field_2._8_8_);
  if (sVar3 == 0xffffffffffffffff) {
    this_local = (cmTarget *)
                 cmMakefile::GetOrCreateSource
                           (this->Makefile,(string *)sfl.Name.field_2._8_8_,false);
  }
  else {
    this_local = (cmTarget *)0x0;
  }
  cmSourceFileLocation::~cmSourceFileLocation((cmSourceFileLocation *)local_70);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src)
{
  cmSourceFileLocation sfl(this->Makefile, src);
  if (std::find_if(this->Internal->SourceEntries.begin(),
                   this->Internal->SourceEntries.end(),
                   TargetPropertyEntryFinder(sfl))
                                      == this->Internal->SourceEntries.end())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  if (cmGeneratorExpression::Find(src) != std::string::npos)
    {
    return 0;
    }
  return this->Makefile->GetOrCreateSource(src);
}